

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gulcalc.cpp
# Opt level: O0

void __thiscall gulcalc::clearmode1_data(gulcalc *this)

{
  bool bVar1;
  reference piVar2;
  reference this_00;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_20;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_18;
  iterator iter;
  gulcalc *this_local;
  
  iter._M_current = (int *)this;
  local_18._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin(&this->mode1UsedCoverageIDs_);
  while( true ) {
    local_20._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::end(&this->mode1UsedCoverageIDs_);
    bVar1 = __gnu_cxx::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    piVar2 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&local_18);
    this_00 = std::
              vector<std::vector<processrecData,_std::allocator<processrecData>_>,_std::allocator<std::vector<processrecData,_std::allocator<processrecData>_>_>_>
              ::operator[](&this->mode1_stats_,(long)*piVar2);
    std::vector<processrecData,_std::allocator<processrecData>_>::clear(this_00);
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_18,0);
  }
  std::vector<int,_std::allocator<int>_>::clear(&this->mode1UsedCoverageIDs_);
  return;
}

Assistant:

void gulcalc::clearmode1_data() {

	auto iter = mode1UsedCoverageIDs_.begin();
	while (iter != mode1UsedCoverageIDs_.end()) {
		mode1_stats_[*iter].clear();
		iter++;
	}
	mode1UsedCoverageIDs_.clear();
}